

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_tests.cpp
# Opt level: O3

void __thiscall base64_tests::base64_testvectors::test_method(base64_testvectors *this)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Span<const_unsigned_char> input;
  byte *pbVar3;
  Span<const_unsigned_char> input_00;
  size_t __n;
  undefined1 uVar4;
  int iVar5;
  undefined8 uVar6;
  char *pcVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long lVar10;
  long in_FS_OFFSET;
  readonly_property<bool> rVar11;
  bool bVar12;
  const_string file;
  string_view str;
  const_string file_00;
  const_string file_01;
  initializer_list<unsigned_char> __l;
  initializer_list<std::byte> __l_00;
  const_string file_02;
  Span<const_unsigned_char> input_01;
  const_string file_03;
  Span<const_unsigned_char> input_02;
  const_string file_04;
  const_string file_05;
  string_view str_00;
  const_string file_06;
  string_view str_01;
  const_string file_07;
  string_view str_02;
  const_string file_08;
  string_view str_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  check_type cVar13;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  assertion_result local_200;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  vector<std::byte,_std::allocator<std::byte>_> in_b;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_u;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  string *local_110;
  string *local_108;
  char *local_100;
  char *local_f8;
  assertion_result local_f0;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> dec;
  string local_b8;
  string out_exp;
  string strEnc;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((test_method()::vstrIn_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&test_method()::vstrIn_abi_cxx11_), iVar5 != 0)) {
    test_method()::vstrIn_abi_cxx11_[0]._M_dataplus._M_p =
         (pointer)&test_method()::vstrIn_abi_cxx11_[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)test_method()::vstrIn_abi_cxx11_,"");
    test_method()::vstrIn_abi_cxx11_[1]._M_dataplus._M_p =
         (pointer)&test_method()::vstrIn_abi_cxx11_[1].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrIn_abi_cxx11_ + 1),"f","");
    test_method()::vstrIn_abi_cxx11_[2]._M_dataplus._M_p =
         (pointer)&test_method()::vstrIn_abi_cxx11_[2].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrIn_abi_cxx11_ + 2),"fo","");
    test_method()::vstrIn_abi_cxx11_[3]._M_dataplus._M_p =
         (pointer)&test_method()::vstrIn_abi_cxx11_[3].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrIn_abi_cxx11_ + 3),"foo","");
    test_method()::vstrIn_abi_cxx11_[4]._M_dataplus._M_p =
         (pointer)&test_method()::vstrIn_abi_cxx11_[4].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrIn_abi_cxx11_ + 4),"foob","");
    test_method()::vstrIn_abi_cxx11_[5]._M_dataplus._M_p =
         (pointer)&test_method()::vstrIn_abi_cxx11_[5].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrIn_abi_cxx11_ + 5),"fooba","");
    test_method()::vstrIn_abi_cxx11_[6]._M_dataplus._M_p =
         (pointer)&test_method()::vstrIn_abi_cxx11_[6].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrIn_abi_cxx11_ + 6),"foobar","");
    __cxa_atexit(::__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&test_method()::vstrIn_abi_cxx11_);
  }
  if ((test_method()::vstrOut_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&test_method()::vstrOut_abi_cxx11_), iVar5 != 0)) {
    test_method()::vstrOut_abi_cxx11_[0]._M_dataplus._M_p =
         (pointer)&test_method()::vstrOut_abi_cxx11_[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)test_method()::vstrOut_abi_cxx11_,"");
    test_method()::vstrOut_abi_cxx11_[1]._M_dataplus._M_p =
         (pointer)&test_method()::vstrOut_abi_cxx11_[1].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrOut_abi_cxx11_ + 1),"Zg==","");
    test_method()::vstrOut_abi_cxx11_[2]._M_dataplus._M_p =
         (pointer)&test_method()::vstrOut_abi_cxx11_[2].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrOut_abi_cxx11_ + 2),"Zm8=","");
    test_method()::vstrOut_abi_cxx11_[3]._M_dataplus._M_p =
         (pointer)&test_method()::vstrOut_abi_cxx11_[3].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrOut_abi_cxx11_ + 3),"Zm9v","");
    test_method()::vstrOut_abi_cxx11_[4]._M_dataplus._M_p =
         (pointer)&test_method()::vstrOut_abi_cxx11_[4].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrOut_abi_cxx11_ + 4),"Zm9vYg==","");
    test_method()::vstrOut_abi_cxx11_[5]._M_dataplus._M_p =
         (pointer)&test_method()::vstrOut_abi_cxx11_[5].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrOut_abi_cxx11_ + 5),"Zm9vYmE=","");
    test_method()::vstrOut_abi_cxx11_[6]._M_dataplus._M_p =
         (pointer)&test_method()::vstrOut_abi_cxx11_[6].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(test_method()::vstrOut_abi_cxx11_ + 6),"Zm9vYmFy","");
    __cxa_atexit(__cxx_global_array_dtor_19,0,&__dso_handle);
    __cxa_guard_release(&test_method()::vstrOut_abi_cxx11_);
  }
  lVar10 = 0;
  do {
    input.m_data = *(uchar **)&test_method()::vstrIn_abi_cxx11_[lVar10]._M_dataplus;
    input.m_size = test_method()::vstrIn_abi_cxx11_[lVar10]._M_string_length;
    EncodeBase64_abi_cxx11_(&strEnc,input);
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_118 = "";
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x17;
    file.m_begin = (iterator)&local_120;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_130,msg);
    out_exp._M_string_length = out_exp._M_string_length & 0xffffffffffffff00;
    out_exp._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
    out_exp.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    out_exp.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    psVar1 = test_method()::vstrOut_abi_cxx11_ + lVar10;
    __n = CONCAT71(strEnc._M_string_length._1_7_,(undefined1)strEnc._M_string_length);
    if (__n == test_method()::vstrOut_abi_cxx11_[lVar10]._M_string_length) {
      if (__n == 0) {
        rVar11.super_class_property<bool>.value = (class_property<bool>)true;
      }
      else {
        iVar5 = bcmp(strEnc._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p,__n);
        rVar11.super_class_property<bool>.value = (class_property<bool>)(iVar5 == 0);
      }
    }
    else {
      rVar11.super_class_property<bool>.value = (class_property<bool>)false;
    }
    local_200.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar11.super_class_property<bool>.value;
    local_200.m_message.px = (element_type *)0x0;
    local_200.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_b8._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_b8._M_string_length = 0xe3a7d8;
    local_f0._0_8_ = &strEnc;
    dec.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_payload._8_1_ = 0;
    dec.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388fc8;
    dec.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    dec.
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _24_8_ = &local_f0;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = &in_u;
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)psVar1;
    boost::test_tools::tt_detail::report_assertion
              (&local_200,(lazy_ostream *)&out_exp,1,2,REQUIRE,0xe39cbb,(size_t)&local_b8,0x17,&dec,
               "vstrOut[i]",local_58);
    boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
    str._M_len._1_7_ = strEnc._M_string_length._1_7_;
    str._M_len._0_1_ = (undefined1)strEnc._M_string_length;
    str._M_str = strEnc._M_dataplus._M_p;
    DecodeBase64(&dec,str);
    local_140 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_138 = "";
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar13 = 0x2bdf58;
    file_00.m_end = (iterator)0x19;
    file_00.m_begin = (iterator)&local_140;
    msg_00.m_end = pvVar9;
    msg_00.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
               msg_00);
    out_exp._M_dataplus._M_p._0_1_ =
         dec.
         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
         _M_engaged;
    out_exp._M_string_length = 0;
    out_exp.field_2._M_allocated_capacity = 0;
    local_200._0_8_ = "dec";
    local_200.m_message.px = (element_type *)0xe39ce4;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_01389048;
    local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = &local_200;
    local_160 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_158 = "";
    pvVar8 = (iterator)0x2;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&out_exp,(lazy_ostream *)local_58,2,0,WARN,_cVar13,
               (size_t)&local_160,0x19);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&out_exp.field_2._M_allocated_capacity);
    local_170 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_168 = "";
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar13 = 0x2be064;
    file_01.m_end = (iterator)0x1a;
    file_01.m_begin = (iterator)&local_170;
    msg_01.m_end = pvVar9;
    msg_01.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_180,
               msg_01);
    pbVar3 = (byte *)CONCAT71(dec.
                              super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ._M_payload._9_7_,
                              dec.
                              super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ._M_payload._8_1_);
    if ((long)pbVar3 -
        dec.
        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
        _M_payload._0_8_ == test_method()::vstrIn_abi_cxx11_[lVar10]._M_string_length) {
      uVar4 = 1;
      if (dec.
          super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != pbVar3) {
        pcVar7 = test_method()::vstrIn_abi_cxx11_[lVar10]._M_dataplus._M_p;
        uVar6 = dec.
                super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ._M_payload._M_value.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
        do {
          if ((uint)*(byte *)uVar6 != (int)*pcVar7) {
            uVar4 = 0;
            break;
          }
          uVar6 = uVar6 + 1;
          pcVar7 = pcVar7 + 1;
        } while ((byte *)uVar6 != pbVar3);
      }
    }
    else {
      uVar4 = 0;
    }
    out_exp._M_dataplus._M_p._0_1_ = uVar4;
    out_exp._M_string_length = 0;
    out_exp.field_2._M_allocated_capacity = 0;
    local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
    local_58._0_8_ = &PTR__lazy_ostream_01388e08;
    local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_190 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
    ;
    local_188 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    local_48._8_8_ = psVar1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&out_exp,(lazy_ostream *)local_58,1,1,WARN,_cVar13,
               (size_t)&local_190,0x1a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&out_exp.field_2._M_allocated_capacity);
    if ((dec.
         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
         _M_engaged == true) &&
       (dec.
        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
        _24_8_ = dec.
                 super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ._24_8_ & 0xffffffffffffff00,
       dec.
       super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
       _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
       .super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(dec.
                      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ._M_payload._M_value.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)dec.
                            super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ._M_payload._M_value.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      dec.
                      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ._M_payload._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strEnc._M_dataplus._M_p != &strEnc.field_2) {
      operator_delete(strEnc._M_dataplus._M_p,strEnc.field_2._M_allocated_capacity + 1);
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 7) {
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._0_3_ = 0xff01ff;
      __l._M_len = 3;
      __l._M_array = (iterator)&dec;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&in_u,__l,(allocator_type *)local_58);
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._0_3_ = 0xff01ff;
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)&dec;
      std::vector<std::byte,_std::allocator<std::byte>_>::vector
                (&in_b,__l_00,(allocator_type *)local_58);
      strEnc._M_dataplus._M_p = (pointer)&strEnc.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&strEnc,anon_var_dwarf_3c97fb,anon_var_dwarf_3c97fb + 3);
      out_exp._M_dataplus._M_p = (pointer)&out_exp.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out_exp,"/wH/","");
      local_1d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_1c8 = "";
      local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x22;
      file_02.m_begin = (iterator)&local_1d0;
      msg_02.m_end = in_R9;
      msg_02.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e0,
                 msg_02);
      local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
      local_200._0_8_ = &PTR__lazy_ostream_01388f08;
      local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_1e8 = "";
      input_01.m_size =
           (long)in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      input_01.m_data =
           in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      EncodeBase64_abi_cxx11_(&local_b8,input_01);
      if (local_b8._M_string_length == out_exp._M_string_length) {
        if ((char *)local_b8._M_string_length == (char *)0x0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp(local_b8._M_dataplus._M_p,out_exp._M_dataplus._M_p,local_b8._M_string_length)
          ;
          bVar12 = iVar5 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar12;
      local_f0.m_message.px = (element_type *)0x0;
      local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_100 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_f8 = "";
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._8_1_ = 0;
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388fc8;
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
      local_110 = &out_exp;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x2;
      local_108 = &local_b8;
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _24_8_ = &local_108;
      local_48._8_8_ = &local_110;
      boost::test_tools::tt_detail::report_assertion
                (&local_f0,(lazy_ostream *)&local_200,1,2,REQUIRE,0xe3a81f,(size_t)&local_100,0x22,
                 &dec,"out_exp",(allocator_type *)local_58);
      boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
      paVar2 = &local_b8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_210 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_208 = "";
      local_220 = &boost::unit_test::basic_cstring<char_const>::null;
      local_218 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x23;
      file_03.m_begin = (iterator)&local_210;
      msg_03.m_end = pvVar9;
      msg_03.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_220,
                 msg_03);
      local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
      local_200._0_8_ = &PTR__lazy_ostream_01388f08;
      local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_1e8 = "";
      input_02.m_size =
           (long)in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      input_02.m_data =
           in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      EncodeBase64_abi_cxx11_(&local_b8,input_02);
      if (local_b8._M_string_length == out_exp._M_string_length) {
        if ((char *)local_b8._M_string_length == (char *)0x0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp(local_b8._M_dataplus._M_p,out_exp._M_dataplus._M_p,local_b8._M_string_length)
          ;
          bVar12 = iVar5 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar12;
      local_f0.m_message.px = (element_type *)0x0;
      local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_100 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_f8 = "";
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._8_1_ = 0;
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388fc8;
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
      local_110 = &out_exp;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x2;
      local_108 = &local_b8;
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _24_8_ = &local_108;
      local_48._8_8_ = &local_110;
      boost::test_tools::tt_detail::report_assertion
                (&local_f0,(lazy_ostream *)&local_200,1,2,REQUIRE,0xe3a83a,(size_t)&local_100,0x23,
                 &dec,"out_exp",local_58);
      boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_230 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_228 = "";
      local_240 = &boost::unit_test::basic_cstring<char_const>::null;
      local_238 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x24;
      file_04.m_begin = (iterator)&local_230;
      msg_04.m_end = pvVar9;
      msg_04.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_240,
                 msg_04);
      local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
      local_200._0_8_ = &PTR__lazy_ostream_01388f08;
      local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_1e8 = "";
      input_00.m_size._0_1_ = (undefined1)strEnc._M_string_length;
      input_00.m_data = (uchar *)strEnc._M_dataplus._M_p;
      input_00.m_size._1_7_ = strEnc._M_string_length._1_7_;
      EncodeBase64_abi_cxx11_(&local_b8,input_00);
      if (local_b8._M_string_length == out_exp._M_string_length) {
        if ((char *)local_b8._M_string_length == (char *)0x0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp(local_b8._M_dataplus._M_p,out_exp._M_dataplus._M_p,local_b8._M_string_length)
          ;
          bVar12 = iVar5 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar12;
      local_f0.m_message.px = (element_type *)0x0;
      local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_100 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_f8 = "";
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._8_1_ = 0;
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388fc8;
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
      local_110 = &out_exp;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x2;
      local_108 = &local_b8;
      dec.
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _24_8_ = &local_108;
      local_48._8_8_ = &local_110;
      boost::test_tools::tt_detail::report_assertion
                (&local_f0,(lazy_ostream *)&local_200,1,2,REQUIRE,0xe3a84d,(size_t)&local_100,0x24,
                 &dec,"out_exp",local_58);
      boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_exp._M_dataplus._M_p != &out_exp.field_2) {
        operator_delete(out_exp._M_dataplus._M_p,out_exp.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)strEnc._M_dataplus._M_p != &strEnc.field_2) {
        operator_delete(strEnc._M_dataplus._M_p,strEnc.field_2._M_allocated_capacity + 1);
      }
      if (in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)in_b.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)in_u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_250 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_248 = "";
      local_260 = &boost::unit_test::basic_cstring<char_const>::null;
      local_258 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = &DAT_00000028;
      file_05.m_begin = (iterator)&local_250;
      msg_05.m_end = pvVar9;
      msg_05.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_260,
                 msg_05);
      local_48._M_allocated_capacity = 0x64696c61766e69;
      local_58._8_8_ = 8;
      local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
      _cVar13 = 0x2be8eb;
      str_00._M_str = (char *)&local_48;
      str_00._M_len = 8;
      local_58._0_8_ = &local_48;
      DecodeBase64(&dec,str_00);
      out_exp._M_dataplus._M_p =
           (pointer)(CONCAT71(out_exp._M_dataplus._M_p._1_7_,
                              dec.
                              super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ._M_engaged) ^ 1);
      out_exp._M_string_length = 0;
      out_exp.field_2._M_allocated_capacity = 0;
      local_200._0_8_ = "!DecodeBase64(\"invalid\\0\"s)";
      local_200.m_message.px = (element_type *)0xe3a87b;
      strEnc._M_string_length._0_1_ = 0;
      strEnc._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      strEnc.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_270 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_268 = "";
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x0;
      strEnc.field_2._8_8_ = (lazy_ostream *)&local_200;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&out_exp,(lazy_ostream *)&strEnc,1,0,WARN,_cVar13,
                 (size_t)&local_270,0x28);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&out_exp.field_2._M_allocated_capacity);
      if ((dec.
           super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ._M_engaged == true) &&
         (dec.
          super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ._24_8_ = dec.
                    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._24_8_ & 0xffffffffffffff00,
         dec.
         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
         _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(dec.
                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)dec.
                              super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ._M_payload._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        dec.
                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_payload._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
      }
      local_280 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_278 = "";
      local_290 = &boost::unit_test::basic_cstring<char_const>::null;
      local_288 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x29;
      file_06.m_begin = (iterator)&local_280;
      msg_06.m_end = pvVar9;
      msg_06.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_290,
                 msg_06);
      local_48._M_allocated_capacity = 0x3d775a702f42516e;
      local_58._8_8_ = 8;
      local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
      _cVar13 = 0x2bea4c;
      str_01._M_str = (char *)&local_48;
      str_01._M_len = 8;
      local_58._0_8_ = &local_48;
      DecodeBase64(&dec,str_01);
      out_exp._M_dataplus._M_p._0_1_ =
           dec.
           super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ._M_engaged;
      out_exp._M_string_length = 0;
      out_exp.field_2._M_allocated_capacity = 0;
      local_200._0_8_ = "DecodeBase64(\"nQB/pZw=\"s)";
      local_200.m_message.px = (element_type *)0xe3a895;
      strEnc._M_string_length._0_1_ = 0;
      strEnc._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      strEnc.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_2a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_298 = "";
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x0;
      strEnc.field_2._8_8_ = (lazy_ostream *)&local_200;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&out_exp,(lazy_ostream *)&strEnc,1,0,WARN,_cVar13,
                 (size_t)&local_2a0,0x29);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&out_exp.field_2._M_allocated_capacity);
      if ((dec.
           super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ._M_engaged == true) &&
         (dec.
          super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ._24_8_ = dec.
                    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._24_8_ & 0xffffffffffffff00,
         dec.
         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
         _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(dec.
                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)dec.
                              super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ._M_payload._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        dec.
                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_payload._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
      }
      local_2b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_2a8 = "";
      local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_07.m_end = (iterator)0x2a;
      file_07.m_begin = (iterator)&local_2b0;
      msg_07.m_end = pvVar9;
      msg_07.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2c0,
                 msg_07);
      strEnc._M_dataplus._M_p = (pointer)0x10;
      local_58._0_8_ = &local_48;
      local_58._0_8_ =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     (size_type *)&strEnc,0);
      local_48._M_allocated_capacity = (size_type)strEnc._M_dataplus._M_p;
      *(undefined8 *)local_58._0_8_ = 0x3d775a702f42516e;
      *(undefined8 *)(local_58._0_8_ + 8) = 0x64696c61766e6900;
      local_58._8_8_ = strEnc._M_dataplus._M_p;
      *(local_58._0_8_ + strEnc._M_dataplus._M_p) = '\0';
      _cVar13 = 0x2bebbe;
      str_02._M_str = (char *)local_58._0_8_;
      str_02._M_len = (size_t)strEnc._M_dataplus._M_p;
      DecodeBase64(&dec,str_02);
      out_exp._M_dataplus._M_p =
           (pointer)(CONCAT71(out_exp._M_dataplus._M_p._1_7_,
                              dec.
                              super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ._M_engaged) ^ 1);
      out_exp._M_string_length = 0;
      out_exp.field_2._M_allocated_capacity = 0;
      local_200._0_8_ = "!DecodeBase64(\"nQB/pZw=\\0invalid\"s)";
      local_200.m_message.px = (element_type *)0xe3a8b9;
      strEnc._M_string_length._0_1_ = 0;
      strEnc._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      strEnc.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_2d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_2c8 = "";
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x0;
      strEnc.field_2._8_8_ = (lazy_ostream *)&local_200;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&out_exp,(lazy_ostream *)&strEnc,1,0,WARN,_cVar13,
                 (size_t)&local_2d0,0x2a);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&out_exp.field_2._M_allocated_capacity);
      if ((dec.
           super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ._M_engaged == true) &&
         (dec.
          super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ._24_8_ = dec.
                    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._24_8_ & 0xffffffffffffff00,
         dec.
         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
         _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(dec.
                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)dec.
                              super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ._M_payload._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        dec.
                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_payload._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
      }
      local_2e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_2d8 = "";
      local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0x2b;
      file_08.m_begin = (iterator)&local_2e0;
      msg_08.m_end = pvVar9;
      msg_08.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f0,
                 msg_08);
      strEnc._M_dataplus._M_p = (pointer)0x10;
      local_58._0_8_ = &local_48;
      local_58._0_8_ =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     (size_type *)&strEnc,0);
      local_48._M_allocated_capacity = (size_type)strEnc._M_dataplus._M_p;
      *(undefined8 *)local_58._0_8_ = 0x3d775a702f42516e;
      *(undefined8 *)(local_58._0_8_ + 8) = 0x64696c61766e69;
      local_58._8_8_ = strEnc._M_dataplus._M_p;
      *(local_58._0_8_ + strEnc._M_dataplus._M_p) = '\0';
      _cVar13 = 0x2bed35;
      str_03._M_str = (char *)local_58._0_8_;
      str_03._M_len = (size_t)strEnc._M_dataplus._M_p;
      DecodeBase64(&dec,str_03);
      out_exp._M_dataplus._M_p =
           (pointer)(CONCAT71(out_exp._M_dataplus._M_p._1_7_,
                              dec.
                              super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ._M_engaged) ^ 1);
      out_exp._M_string_length = 0;
      out_exp.field_2._M_allocated_capacity = 0;
      local_200._0_8_ = "!DecodeBase64(\"nQB/pZw=invalid\\0\"s)";
      local_200.m_message.px = (element_type *)0xe3a8dd;
      strEnc._M_string_length._0_1_ = 0;
      strEnc._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      strEnc.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_300 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base64_tests.cpp"
      ;
      local_2f8 = "";
      strEnc.field_2._8_8_ = (lazy_ostream *)&local_200;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&out_exp,(lazy_ostream *)&strEnc,1,0,WARN,_cVar13,
                 (size_t)&local_300,0x2b);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&out_exp.field_2._M_allocated_capacity);
      if ((dec.
           super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ._M_engaged == true) &&
         (dec.
          super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ._24_8_ = dec.
                    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ._24_8_ & 0xffffffffffffff00,
         dec.
         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
         _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(dec.
                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)dec.
                              super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ._M_payload._M_value.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        dec.
                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_payload._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(base64_testvectors)
{
    static const std::string vstrIn[]  = {"","f","fo","foo","foob","fooba","foobar"};
    static const std::string vstrOut[] = {"","Zg==","Zm8=","Zm9v","Zm9vYg==","Zm9vYmE=","Zm9vYmFy"};
    for (unsigned int i=0; i<std::size(vstrIn); i++)
    {
        std::string strEnc = EncodeBase64(vstrIn[i]);
        BOOST_CHECK_EQUAL(strEnc, vstrOut[i]);
        auto dec = DecodeBase64(strEnc);
        BOOST_REQUIRE(dec);
        BOOST_CHECK_MESSAGE(std::ranges::equal(*dec, vstrIn[i]), vstrOut[i]);
    }

    {
        const std::vector<uint8_t> in_u{0xff, 0x01, 0xff};
        const std::vector<std::byte> in_b{std::byte{0xff}, std::byte{0x01}, std::byte{0xff}};
        const std::string in_s{"\xff\x01\xff"};
        const std::string out_exp{"/wH/"};
        BOOST_CHECK_EQUAL(EncodeBase64(in_u), out_exp);
        BOOST_CHECK_EQUAL(EncodeBase64(in_b), out_exp);
        BOOST_CHECK_EQUAL(EncodeBase64(in_s), out_exp);
    }

    // Decoding strings with embedded NUL characters should fail
    BOOST_CHECK(!DecodeBase64("invalid\0"s));
    BOOST_CHECK(DecodeBase64("nQB/pZw="s));
    BOOST_CHECK(!DecodeBase64("nQB/pZw=\0invalid"s));
    BOOST_CHECK(!DecodeBase64("nQB/pZw=invalid\0"s));
}